

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O0

void __thiscall TPZAcademicGeoMesh::DeformGMesh(TPZAcademicGeoMesh *this,TPZGeoMesh *gmesh)

{
  TPZGeoEl *pTVar1;
  TPZAdmChunkVector<TPZGeoNode,_10> *this_00;
  double *pdVar2;
  TPZGeoMesh *in_RSI;
  TPZGeoMesh *in_RDI;
  int i;
  int64_t nod;
  TPZManVector<double,_3> xafter;
  TPZManVector<double,_3> xbefore;
  int64_t nnodes;
  TPZManVector<double,_3> *in_stack_ffffffffffffff00;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_ffffffffffffff08;
  TPZGeoNode *in_stack_ffffffffffffff10;
  TPZAdmChunkVector<TPZGeoEl_*,_10> *in_stack_ffffffffffffff18;
  TPZChunkVector<TPZGeoEl_*,_10> *in_stack_ffffffffffffff20;
  int local_a4;
  long local_a0;
  undefined1 local_88 [56];
  TPZVec<double> local_50;
  int64_t local_18;
  TPZGeoMesh *local_10;
  
  local_10 = in_RSI;
  this_00 = TPZGeoMesh::NodeVec(in_RSI);
  local_18 = TPZChunkVector<TPZGeoNode,_10>::NElements
                       (&this_00->super_TPZChunkVector<TPZGeoNode,_10>);
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_ffffffffffffff20,(int64_t)in_stack_ffffffffffffff18
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_ffffffffffffff20,(int64_t)in_stack_ffffffffffffff18
            );
  for (local_a0 = 0; local_a0 < local_18; local_a0 = local_a0 + 1) {
    TPZGeoMesh::NodeVec(local_10);
    TPZChunkVector<TPZGeoNode,_10>::operator[]
              ((TPZChunkVector<TPZGeoNode,_10> *)in_stack_ffffffffffffff20,
               (int64_t)in_stack_ffffffffffffff18);
    TPZGeoNode::GetCoordinates
              (in_stack_ffffffffffffff10,(TPZVec<double> *)in_stack_ffffffffffffff08);
    for (local_a4 = 0; local_a4 < 3; local_a4 = local_a4 + 1) {
      pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_a4);
      in_stack_ffffffffffffff20 = (TPZChunkVector<TPZGeoEl_*,_10> *)(*pdVar2 + *pdVar2 + -1.0);
      pdVar2 = TPZVec<double>::operator[](&local_50,(long)local_a4);
      *pdVar2 = (double)in_stack_ffffffffffffff20;
    }
    in_stack_ffffffffffffff18 = TPZGeoMesh::ElementVec(in_RDI);
    in_stack_ffffffffffffff10 =
         (TPZGeoNode *)
         TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                   (in_stack_ffffffffffffff20,(int64_t)in_stack_ffffffffffffff18);
    pTVar1 = (TPZGeoEl *)(in_stack_ffffffffffffff10->super_TPZSavable)._vptr_TPZSavable;
    (**(code **)(*(long *)pTVar1 + 0x228))(pTVar1,&local_50,local_88);
    in_stack_ffffffffffffff08 = TPZGeoMesh::NodeVec(local_10);
    in_stack_ffffffffffffff00 =
         (TPZManVector<double,_3> *)
         TPZChunkVector<TPZGeoNode,_10>::operator[]
                   ((TPZChunkVector<TPZGeoNode,_10> *)in_stack_ffffffffffffff20,
                    (int64_t)in_stack_ffffffffffffff18);
    TPZGeoNode::SetCoord(in_stack_ffffffffffffff10,(TPZVec<double> *)in_stack_ffffffffffffff08);
  }
  TPZManVector<double,_3>::~TPZManVector(in_stack_ffffffffffffff00);
  TPZManVector<double,_3>::~TPZManVector(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void TPZAcademicGeoMesh::DeformGMesh(TPZGeoMesh &gmesh)
{
    int64_t nnodes = gmesh.NodeVec().NElements();
    TPZManVector<REAL,3> xbefore(3),xafter(3);
    for (int64_t nod=0; nod<nnodes; nod++) {
        gmesh.NodeVec()[nod].GetCoordinates(xbefore);
        for (int i=0; i<3; i++) {
            xbefore[i] = 2.*xbefore[i]-1.;
        }
        fDeformed.ElementVec()[0]->X(xbefore, xafter);
        gmesh.NodeVec()[nod].SetCoord(xafter);
    }
}